

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPoolJPolValPair.cpp
# Opt level: O0

PolicyPoolInterface * __thiscall
PolicyPoolJPolValPair::operator=(PolicyPoolJPolValPair *this,PolicyPoolInterface *o)

{
  PolicyPoolJPolValPair *o_00;
  PolicyPoolJPolValPair *in_RSI;
  PolicyPoolJPolValPair *in_RDI;
  PolicyPoolJPolValPair *casted_o;
  PolicyPoolJPolValPair *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    o_00 = (PolicyPoolJPolValPair *)
           __dynamic_cast(in_RSI,&PolicyPoolInterface::typeinfo,&typeinfo,0);
    if (o_00 == (PolicyPoolJPolValPair *)0x0) {
      __cxa_bad_cast();
    }
    local_8 = operator=(in_RDI,o_00);
  }
  return &local_8->super_PolicyPoolInterface;
}

Assistant:

PolicyPoolInterface& PolicyPoolJPolValPair::operator= 
    (const PolicyPoolInterface& o)
{
    if(DEBUG_PPJPVP_ASSIGN)
        cout <<"PolicyPoolInterface& PolicyPoolJPolValPair::operator= \
called."<<endl;
    if (this == &o) return *this;   // Gracefully handle self assignment
    const PolicyPoolJPolValPair& casted_o = 
        dynamic_cast<const PolicyPoolJPolValPair&>(o);

    return(operator=(casted_o));

}